

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O2

void R_RenderBSPNode(void *node)

{
  double dVar1;
  double dVar2;
  short *psVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  float *pfVar7;
  int iVar8;
  uint uVar9;
  short *psVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  DVector2 local_48;
  
  if (numnodes == 0) {
    R_Subsector(subsectors);
    return;
  }
  do {
    if (((ulong)node & 1) != 0) {
      R_Subsector((subsector_t *)((long)&((node_t *)((long)node + -0x48))->field_6 + 0xf));
      return;
    }
    local_48.X = ViewPos.X;
    local_48.Y = ViewPos.Y;
    uVar4 = R_PointOnSide(&local_48,(node_t *)node);
    R_RenderBSPNode(*(void **)((long)&((node_t *)node)->field_6 + (long)(int)uVar4 * 8));
    lVar5 = (long)(int)(uVar4 ^ 1);
    pfVar7 = (float *)((long)&((node_t *)node)->field_4 + lVar5 * 0x10);
    uVar4 = 0;
    uVar9 = 0;
    if ((double)*(float *)((long)&((node_t *)node)->field_4 + lVar5 * 0x10 + 8) < ViewPos.X) {
      uVar9 = 2 - (ViewPos.X <
                  (double)*(float *)((long)&((node_t *)node)->field_4 + lVar5 * 0x10 + 0xc));
    }
    if (ViewPos.Y < (double)*pfVar7) {
      uVar4 = (uint)(ViewPos.Y <=
                    (double)*(float *)((long)&((node_t *)node)->field_4 + lVar5 * 0x10 + 4)) * 4 + 4
      ;
    }
    uVar4 = uVar4 | uVar9;
    if (uVar4 != 5) {
      dVar13 = (double)pfVar7[checkcoord[uVar4][0]] - ViewPos.X;
      dVar14 = (double)pfVar7[checkcoord[uVar4][1]] - ViewPos.Y;
      if (((double)pfVar7[checkcoord[uVar4][0]] - (double)pfVar7[checkcoord[uVar4][2]]) * dVar14 +
          ((double)pfVar7[checkcoord[uVar4][3]] - (double)pfVar7[checkcoord[uVar4][1]]) * dVar13 <
          -1.52587890625e-05) {
        dVar12 = (double)pfVar7[checkcoord[uVar4][3]] - ViewPos.Y;
        dVar11 = (double)pfVar7[checkcoord[uVar4][2]] - ViewPos.X;
        dVar1 = ViewSin * dVar11 - ViewCos * dVar12;
        dVar2 = ViewSin * dVar13 - ViewCos * dVar14;
        dVar12 = ViewTanSin * dVar12 + ViewTanCos * dVar11;
        dVar11 = ViewTanSin * dVar14 + ViewTanCos * dVar13;
        dVar14 = dVar12;
        dVar13 = dVar1;
        if (((byte)MirrorFlags & 1) != 0) {
          dVar13 = -dVar2;
          dVar2 = -dVar1;
          dVar14 = dVar11;
          dVar11 = dVar12;
        }
        if (-dVar11 <= dVar2) {
          if (dVar11 < dVar2) {
            return;
          }
          if (dVar11 == 0.0) {
            return;
          }
          iVar6 = SUB84(CenterX + 6755399441055744.0 + (CenterX * dVar2) / dVar11,0);
        }
        else {
          if (dVar13 < -dVar14) {
            return;
          }
          iVar6 = 0;
          if (dVar2 + dVar11 == dVar13 + dVar14) {
            return;
          }
        }
        if (dVar13 <= dVar14) {
          if (dVar13 < -dVar14) {
            return;
          }
          if (dVar14 == 0.0) {
            return;
          }
          iVar8 = SUB84(CenterX + 6755399441055744.0 + (dVar13 * CenterX) / dVar14,0);
        }
        else {
          if (dVar11 < dVar2) {
            return;
          }
          iVar8 = viewwidth;
          if (dVar2 + dVar14 == dVar13 + dVar11) {
            return;
          }
        }
        if (iVar8 <= iVar6) {
          return;
        }
        psVar3 = &solidsegs[0].last;
        do {
          psVar10 = psVar3;
          psVar3 = psVar10 + 2;
        } while (*psVar10 < iVar8);
        if (((cliprange_t *)(psVar10 + -1))->first <= iVar6) {
          return;
        }
      }
    }
    node = *(void **)((long)&((node_t *)node)->field_6 + lVar5 * 8);
  } while( true );
}

Assistant:

void R_RenderBSPNode (void *node)
{
	if (numnodes == 0)
	{
		R_Subsector (subsectors);
		return;
	}
	while (!((size_t)node & 1))  // Keep going until found a subsector
	{
		node_t *bsp = (node_t *)node;

		// Decide which side the view point is on.
		int side = R_PointOnSide (ViewPos, bsp);

		// Recursively divide front space (toward the viewer).
		R_RenderBSPNode (bsp->children[side]);

		// Possibly divide back space (away from the viewer).
		side ^= 1;
		if (!R_CheckBBox (bsp->bbox[side]))
			return;

		node = bsp->children[side];
	}
	R_Subsector ((subsector_t *)((BYTE *)node - 1));
}